

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<chrono::ChBody>(ChArchiveIn *this,ChNameValue<chrono::ChBody_*> *bVal)

{
  ChFunctorArchiveInSpecificPtr<chrono::ChBody> specFuncA;
  undefined **local_28;
  ChBody **local_20;
  char *local_18;
  undefined1 *local_10;
  char local_8;
  
  local_10 = (undefined1 *)&local_28;
  local_20 = bVal->_value;
  local_28 = &PTR__ChFunctorArchiveIn_0115ca70;
  local_18 = bVal->_name;
  local_8 = bVal->_flags;
  (**(code **)(*(long *)this + 0x68))();
  return;
}

Assistant:

void in     (ChNameValue<T*> bVal) {
          ChFunctorArchiveInSpecificPtr<T> specFuncA(&bVal.value());
          /*void* newptr =*/ this->in_ref(ChNameValue<ChFunctorArchiveIn>(bVal.name(), specFuncA, bVal.flags()) );
      }